

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_get(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  cache_struct *__ptr;
  cache_struct_t *pcVar1;
  void *pvVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  cache_struct_t *next;
  cache_struct_t *last;
  int cache_size;
  cache_struct_t *cache_temp_pointer;
  cache_struct_t *cache_new;
  void *new_buf_1;
  void *temp_buf;
  int temp_hi [7];
  int temp_lo [7];
  int sub_chk;
  int chk;
  int match;
  cache_struct_t *cache_temp_pointer_1;
  void *new_buf;
  Integer bstart [7];
  Integer nld [7];
  Integer ncount [7];
  Integer nstart [7];
  int ndim;
  int nelem;
  int i;
  property_type ga_property;
  Integer handle;
  Integer in_stack_000004e0;
  Integer *in_stack_000004e8;
  void *in_stack_000004f0;
  Integer *in_stack_000004f8;
  Integer *in_stack_00000500;
  Integer in_stack_00000508;
  Integer in_stack_00000530;
  Integer *in_stack_00000538;
  cache_struct *local_1d0;
  int local_1bc;
  int aiStack_198 [8];
  int aiStack_178 [10];
  int local_150;
  int local_14c;
  cache_struct_t *local_148;
  void *local_140;
  undefined8 local_138 [8];
  long local_f8 [3];
  Integer *in_stack_ffffffffffffff20;
  Integer *in_stack_ffffffffffffff28;
  Integer *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  long local_b8;
  void *in_stack_ffffffffffffff50;
  Integer *in_stack_ffffffffffffff58;
  Integer *in_stack_ffffffffffffff60;
  long local_78 [7];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_18;
  long local_10;
  
  local_30 = in_RDI + 1000;
  local_34 = GA[local_30].property;
  if (GA[local_30].property == 2) {
    local_40 = (int)GA[local_30].ndim;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if (GA[local_30].cache_head != (cache_struct_t *)0x0) {
      local_148 = GA[local_30].cache_head;
      local_14c = 0;
LAB_001debef:
      if (local_148 != (cache_struct_t *)0x0) {
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          aiStack_178[local_38] = local_148->lo[local_38];
          aiStack_198[local_38] = local_148->hi[local_38];
        }
        local_150 = 1;
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          if ((*(long *)(local_10 + (long)local_38 * 8) < (long)aiStack_178[local_38]) ||
             ((long)aiStack_198[local_38] < *(long *)(local_18 + (long)local_38 * 8))) {
            local_150 = 0;
            break;
          }
        }
        if (local_150 == 0) goto LAB_001deeef;
        local_3c = 1;
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          local_3c = local_3c *
                     (((int)*(undefined8 *)(local_18 + (long)local_38 * 8) -
                      (int)*(undefined8 *)(local_10 + (long)local_38 * 8)) + 1);
        }
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          local_78[local_38] =
               *(long *)(local_10 + (long)local_38 * 8) - (long)aiStack_178[local_38];
          local_138[local_38] = 0;
          local_f8[local_38] = (long)((aiStack_198[local_38] - aiStack_178[local_38]) + 1);
          (&local_b8)[local_38] =
               (*(long *)(local_18 + (long)local_38 * 8) - *(long *)(local_10 + (long)local_38 * 8))
               + 1;
        }
        gai_mem_copy(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
        local_14c = 1;
      }
      if (local_14c == 0) {
        pcVar1 = (cache_struct_t *)malloc(0x48);
        local_3c = 1;
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          pcVar1->lo[local_38] = (int)*(undefined8 *)(local_10 + (long)local_38 * 8);
          pcVar1->hi[local_38] = (int)*(undefined8 *)(local_18 + (long)local_38 * 8);
          local_3c = local_3c *
                     (((int)*(undefined8 *)(local_18 + (long)local_38 * 8) -
                      (int)*(undefined8 *)(local_10 + (long)local_38 * 8)) + 1);
        }
        pvVar2 = malloc((long)(GA[local_30].elemsize * local_3c));
        pcVar1->cache_buf = pvVar2;
        pcVar1->next = GA[local_30].cache_head;
        GA[local_30].cache_head = pcVar1;
        ngai_get_common(in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f0,
                        in_stack_000004e8,in_stack_000004e0,in_stack_00000530,in_stack_00000538);
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          local_78[local_38] = 0;
          local_138[local_38] = 0;
          local_f8[local_38] =
               (*(long *)(local_18 + (long)local_38 * 8) - *(long *)(local_10 + (long)local_38 * 8))
               + 1;
          (&local_b8)[local_38] = local_f8[local_38];
        }
        gai_mem_copy(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
      }
      goto LAB_001df1ee;
    }
    pcVar1 = (cache_struct_t *)malloc(0x48);
    GA[local_30].cache_head = pcVar1;
    local_3c = 1;
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      (GA[local_30].cache_head)->lo[local_38] = (int)*(undefined8 *)(local_10 + (long)local_38 * 8);
      (GA[local_30].cache_head)->hi[local_38] = (int)*(undefined8 *)(local_18 + (long)local_38 * 8);
      local_3c = local_3c *
                 (((int)*(undefined8 *)(local_18 + (long)local_38 * 8) -
                  (int)*(undefined8 *)(local_10 + (long)local_38 * 8)) + 1);
    }
    pvVar2 = malloc((long)(GA[local_30].elemsize * local_3c));
    (GA[local_30].cache_head)->cache_buf = pvVar2;
    (GA[local_30].cache_head)->next = (cache_struct *)0x0;
    local_140 = (GA[local_30].cache_head)->cache_buf;
    ngai_get_common(in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f0,
                    in_stack_000004e8,in_stack_000004e0,in_stack_00000530,in_stack_00000538);
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      local_78[local_38] = 0;
      local_138[local_38] = 0;
      local_f8[local_38] =
           (*(long *)(local_18 + (long)local_38 * 8) - *(long *)(local_10 + (long)local_38 * 8)) + 1
      ;
      (&local_b8)[local_38] = local_f8[local_38];
    }
    gai_mem_copy(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
LAB_001df1ee:
    pcVar1 = GA[local_30].cache_head;
    local_1bc = 0;
    while (pcVar1 != (cache_struct_t *)0x0) {
      if (10 < local_1bc) {
        __ptr = pcVar1->next;
        pcVar1->next = (cache_struct *)0x0;
        local_1d0 = __ptr;
        while (local_1d0 != (cache_struct *)0x0) {
          local_1d0 = __ptr->next;
          free(__ptr->cache_buf);
          free(__ptr);
        }
        return;
      }
      local_1bc = local_1bc + 1;
    }
  }
  else {
    ngai_get_common(in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f0,
                    in_stack_000004e8,in_stack_000004e0,in_stack_00000530,in_stack_00000538);
  }
  return;
LAB_001deeef:
  local_148 = local_148->next;
  goto LAB_001debef;
}

Assistant:

void pnga_get(Integer g_a, Integer *lo, Integer *hi,
              void *buf, Integer *ld)
{
  Integer handle = GA_OFFSET + g_a;
  enum property_type ga_property = GA[handle].property;

  if (ga_property != READ_CACHE) /* if array is not read only */
  {
    GA_Internal_Threadsafe_Lock();
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);
    GA_Internal_Threadsafe_Unlock();
  } else {
    int i;
    int nelem;
    int ndim = GA[handle].ndim;
    Integer nstart[MAXDIM], ncount[MAXDIM], nld[MAXDIM];
    Integer bstart[MAXDIM];
    /* ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL); */

    /* cache is empty condition */
    if (GA[handle].cache_head == NULL) {
      GA[handle].cache_head = malloc(sizeof(cache_struct_t));
      nelem = 1;
      for (i=0; i<ndim; i++) {
        GA[handle].cache_head -> lo[i] = lo[i];
        GA[handle].cache_head -> hi[i] = hi[i];
        nelem *= (hi[i]-lo[i]+1);
      }
      GA[handle].cache_head -> cache_buf = malloc(GA[handle].elemsize*nelem);
      GA[handle].cache_head -> next = NULL;

        void *new_buf = GA[handle].cache_head->cache_buf;

      /* place data to receive buffer */
      ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer*)NULL);
   
      for (i=0; i<ndim; i++) {
        nstart[i] = 0;
        bstart[i] = 0;
        nld[i] = (hi[i]-lo[i]+1);
        ncount[i] = nld[i];
      }
      gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
          nstart, nld);
    } else {

      cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
      int match = 0;
      while (cache_temp_pointer != NULL) {
        int chk;
        int sub_chk;
        int temp_lo[MAXDIM];
        int temp_hi[MAXDIM];
        void *temp_buf = cache_temp_pointer->cache_buf;
        for (i=0; i<ndim; i++) {
          temp_lo[i] = cache_temp_pointer->lo[i];
          temp_hi[i] = cache_temp_pointer->hi[i];
        }

        //match
        chk = 1;
        for (i=0; i<ndim; i++) {
          if (!(temp_lo[i] <= lo[i] && temp_hi[i] >= hi[i])) {
            chk = 0;
            break;
          }
        }
        //match
        if (chk) {
          nelem = 1;
          for (i=0; i<ndim; i++) {
            nelem *= (hi[i]-lo[i]+1);
          }
          for (i=0; i<ndim; i++) {
            nstart[i] = (lo[i]-temp_lo[i]);
            bstart[i] = 0;
            nld[i] = (temp_hi[i]-temp_lo[i]+1);
            ncount[i] = (hi[i]-lo[i]+1);
          }
          /* copy data to recieve buffer */
          gai_mem_copy(GA[handle].elemsize,ndim,temp_buf,nstart,ncount,nld,buf,
              bstart, ncount /*ld*/);
          match = 1;
          break;
        }

        cache_temp_pointer = cache_temp_pointer->next;

      }

      //no match condition
      if (match == 0) {
        void *new_buf;
        /* create new node on cache list*/
        cache_struct_t *cache_new = malloc(sizeof(cache_struct_t));
        nelem = 1;
        for (i=0; i<ndim; i++) {
          cache_new -> lo[i] = lo[i];
          cache_new -> hi[i] = hi[i];
          nelem *= (hi[i]-lo[i]+1);
        }
        cache_new -> cache_buf = malloc(GA[handle].elemsize*nelem);
        new_buf = cache_new->cache_buf;
        cache_new -> next = GA[handle].cache_head;
        GA[handle].cache_head = cache_new;


        //place data to recieve buffer
        ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);

        for (i=0; i<ndim; i++) {
          nstart[i] = 0;
          bstart[i] = 0;
          nld[i] = (hi[i]-lo[i]+1);
          ncount[i] = nld[i];
        }
        gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
            nstart, nld);
      }
    }

    /* check number of items cached */
    cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
    int cache_size = 0;

    /* check number of items cached */
    while (cache_temp_pointer != NULL) {
      if (cache_size > MAXCACHE) {
        cache_struct_t *last = cache_temp_pointer;
        cache_struct_t *next = last->next;
        last->next = NULL;
        cache_temp_pointer = next;
        while (next) {
          next = cache_temp_pointer->next;
          free(cache_temp_pointer->cache_buf);
          free(cache_temp_pointer);
        }
        break;
      }
      cache_size++;
    }
    /* end */
  }
}